

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O2

int64_t encoder_sse(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int w,int h)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)w;
  if (w < 1) {
    uVar2 = uVar3;
  }
  if (h < 1) {
    h = 0;
  }
  lVar1 = 0;
  for (; (int)uVar3 != h; uVar3 = (ulong)((int)uVar3 + 1)) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      lVar1 = lVar1 + (ulong)(((uint)a[uVar4] - (uint)b[uVar4]) * ((uint)a[uVar4] - (uint)b[uVar4]))
      ;
    }
    a = a + a_stride;
    b = b + b_stride;
  }
  return lVar1;
}

Assistant:

static int64_t encoder_sse(const uint8_t *a, int a_stride, const uint8_t *b,
                           int b_stride, int w, int h) {
  int i, j;
  int64_t sse = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      const int diff = a[j] - b[j];
      sse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  return sse;
}